

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadTypeSection(BinaryReader *this,Offset section_size)

{
  Enum EVar1;
  Type type_00;
  Type type_01;
  bool bVar2;
  int iVar3;
  Result RVar4;
  pointer pTVar5;
  ulong uVar6;
  uint uVar7;
  pointer pTVar8;
  char *pcVar9;
  char *format;
  pointer pTVar10;
  uint uVar11;
  ulong __new_size;
  long lVar12;
  pointer __new_size_00;
  TypeVector *this_00;
  uint8_t type;
  Index num_results;
  Index num_params;
  Index num_signatures;
  Type form;
  TypeMut local_78;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  ulong local_58;
  TypeVector *local_50;
  TypeVector *local_48;
  Type local_40;
  TypeMutVector *local_38;
  
  iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[9])();
  if (iVar3 == 0) {
    RVar4 = ReadCount(this,&local_5c,"type count");
    if (RVar4.enum_ != Error) {
      iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[10])(this->delegate_,(ulong)local_5c);
      if (iVar3 == 0) {
        if (local_5c != 0) {
          local_38 = &this->fields_;
          this_00 = &this->param_types_;
          local_48 = &this->result_types_;
          uVar6 = 0;
          uVar7 = local_5c;
          local_50 = this_00;
          do {
            if ((this->options_->features).gc_enabled_ == true) {
              RVar4 = ReadType(this,&local_40,"type form");
              if (RVar4.enum_ == Error) {
                return (Result)Error;
              }
            }
            else {
              RVar4 = ReadU8(this,(uint8_t *)&local_78,"type form");
              if (RVar4.enum_ == Error) {
                return (Result)Error;
              }
              if ((undefined1)local_78.type.enum_ != 0x60) {
                PrintError(this,"unexpected type form (got %#x)");
                return (Result)Error;
              }
              local_40.enum_ = Func;
              local_40.type_index_ = 0xffffffff;
            }
            if (local_40.enum_ == Array) {
              if ((this->options_->features).gc_enabled_ == false) {
                pcVar9 = "invalid type form: array not allowed";
                goto LAB_0013e108;
              }
              RVar4 = ReadField(this,&local_78);
              if (RVar4.enum_ == Error) {
                return (Result)Error;
              }
              iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xd])
                                (this->delegate_,uVar6,
                                 CONCAT44(local_78.type.type_index_,local_78.type.enum_),
                                 (ulong)(uint)local_78._8_4_);
              if (iVar3 != 0) {
                pcVar9 = "OnArrayType callback failed";
                goto LAB_0013e108;
              }
            }
            else if (local_40.enum_ == Struct) {
              if ((this->options_->features).gc_enabled_ == false) {
                pcVar9 = "invalid type form: struct not allowed";
                goto LAB_0013e108;
              }
              RVar4 = ReadCount(this,(Index *)&local_78,"field count");
              if (RVar4.enum_ == Error) {
                return (Result)Error;
              }
              __new_size = (ulong)(uint)local_78.type.enum_;
              std::vector<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>::resize
                        (local_38,__new_size);
              if (__new_size != 0) {
                lVar12 = 0;
                do {
                  RVar4 = ReadField(this,(TypeMut *)
                                         ((long)&(((this->fields_).
                                                                                                      
                                                  super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->type).
                                                 enum_ + lVar12));
                  if (RVar4.enum_ == Error) {
                    return (Result)Error;
                  }
                  lVar12 = lVar12 + 0xc;
                } while (__new_size * 0xc != lVar12);
              }
              iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xc])
                                (this->delegate_,uVar6,
                                 (ulong)(uint)((int)((ulong)((long)(this->fields_).
                                                                                                                                      
                                                  super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(this->fields_).
                                                                                                                
                                                  super__Vector_base<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                                              -0x55555555));
              this_00 = local_50;
              if (iVar3 != 0) {
                pcVar9 = "OnStructType callback failed";
                goto LAB_0013e108;
              }
            }
            else {
              if (local_40.enum_ != Func) {
                pcVar9 = "";
                if (local_40.enum_ < Any) {
                  pcVar9 = "-";
                }
                EVar1 = -local_40.enum_;
                if (Any < local_40.enum_) {
                  EVar1 = local_40.enum_;
                }
                uVar6 = (ulong)(uint)EVar1;
                format = "unexpected type form (got %s%#x)";
LAB_0013e4ac:
                PrintError(this,format,pcVar9,uVar6);
                return (Result)Error;
              }
              RVar4 = ReadCount(this,&local_60,"function param count");
              if (RVar4.enum_ == Error) {
                return (Result)Error;
              }
              __new_size_00 = (pointer)(ulong)local_60;
              local_68 = uVar7;
              local_58 = uVar6;
              std::vector<wabt::Type,_std::allocator<wabt::Type>_>::resize
                        (this_00,(size_type)__new_size_00);
              if (__new_size_00 != (pointer)0x0) {
                pTVar8 = (pointer)0x0;
                do {
                  RVar4 = ReadType(this,&local_78.type,"function param type");
                  if (RVar4.enum_ == Error) {
                    return (Result)Error;
                  }
                  type_00.type_index_ = local_78.type.type_index_;
                  type_00.enum_ = local_78.type.enum_;
                  bVar2 = IsConcreteType(this,type_00);
                  if (!bVar2) {
                    pcVar9 = "";
                    if (local_78.type.enum_ < Any) {
                      pcVar9 = "-";
                    }
                    EVar1 = -local_78.type.enum_;
                    if (Any < local_78.type.enum_) {
                      EVar1 = local_78.type.enum_;
                    }
                    uVar6 = (ulong)(uint)EVar1;
                    format = "expected valid param type (got %s%#x)";
                    goto LAB_0013e4ac;
                  }
                  (this_00->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                  super__Vector_impl_data._M_start[(long)pTVar8] = type_00;
                  pTVar8 = (pointer)((long)&pTVar8->enum_ + 1);
                } while (__new_size_00 != pTVar8);
              }
              RVar4 = ReadCount(this,&local_64,"function result count");
              if (RVar4.enum_ == Error) {
                return (Result)Error;
              }
              pTVar8 = (pointer)(ulong)local_64;
              std::vector<wabt::Type,_std::allocator<wabt::Type>_>::resize
                        (local_48,(size_type)pTVar8);
              if (pTVar8 != (pointer)0x0) {
                pTVar5 = (pointer)0x0;
                do {
                  RVar4 = ReadType(this,&local_78.type,"function result type");
                  if (RVar4.enum_ == Error) {
                    return (Result)Error;
                  }
                  type_01.type_index_ = local_78.type.type_index_;
                  type_01.enum_ = local_78.type.enum_;
                  bVar2 = IsConcreteType(this,type_01);
                  if (!bVar2) {
                    pcVar9 = "";
                    if (local_78.type.enum_ < Any) {
                      pcVar9 = "-";
                    }
                    EVar1 = -local_78.type.enum_;
                    if (Any < local_78.type.enum_) {
                      EVar1 = local_78.type.enum_;
                    }
                    uVar6 = (ulong)(uint)EVar1;
                    format = "expected valid result type (got %s%#x)";
                    goto LAB_0013e4ac;
                  }
                  (local_48->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                  super__Vector_impl_data._M_start[(long)pTVar5] = type_01;
                  pTVar5 = (pointer)((long)&pTVar5->enum_ + 1);
                } while (pTVar8 != pTVar5);
              }
              pTVar5 = __new_size_00;
              if (__new_size_00 != (pointer)0x0) {
                pTVar5 = (this->param_types_).
                         super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                         super__Vector_impl_data._M_start;
              }
              pTVar10 = pTVar8;
              if (pTVar8 != (pointer)0x0) {
                pTVar10 = (this->result_types_).
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_start;
              }
              iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb])
                                (this->delegate_,local_58,__new_size_00,pTVar5,pTVar8,pTVar10);
              uVar6 = local_58;
              this_00 = local_50;
              uVar7 = local_68;
              if (iVar3 != 0) {
                pcVar9 = "OnFuncType callback failed";
                goto LAB_0013e108;
              }
            }
            uVar11 = (int)uVar6 + 1;
            uVar6 = (ulong)uVar11;
          } while (uVar11 != uVar7);
        }
        iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xe])();
        if (iVar3 == 0) {
          return (Result)Ok;
        }
        pcVar9 = "EndTypeSection callback failed";
      }
      else {
        pcVar9 = "OnTypeCount callback failed";
      }
LAB_0013e108:
      PrintError(this,pcVar9);
    }
  }
  else {
    PrintError(this,"BeginTypeSection callback failed");
  }
  return (Result)Error;
}

Assistant:

Result BinaryReader::ReadTypeSection(Offset section_size) {
  CALLBACK(BeginTypeSection, section_size);
  Index num_signatures;
  CHECK_RESULT(ReadCount(&num_signatures, "type count"));
  CALLBACK(OnTypeCount, num_signatures);

  for (Index i = 0; i < num_signatures; ++i) {
    Type form;
    if (options_.features.gc_enabled()) {
      CHECK_RESULT(ReadType(&form, "type form"));
    } else {
      uint8_t type;
      CHECK_RESULT(ReadU8(&type, "type form"));
      ERROR_UNLESS(type == 0x60, "unexpected type form (got %#x)", type);
      form = Type::Func;
    }

    switch (form) {
      case Type::Func: {
        Index num_params;
        CHECK_RESULT(ReadCount(&num_params, "function param count"));

        param_types_.resize(num_params);

        for (Index j = 0; j < num_params; ++j) {
          Type param_type;
          CHECK_RESULT(ReadType(&param_type, "function param type"));
          ERROR_UNLESS(IsConcreteType(param_type),
                       "expected valid param type (got " PRItypecode ")",
                       WABT_PRINTF_TYPE_CODE(param_type));
          param_types_[j] = param_type;
        }

        Index num_results;
        CHECK_RESULT(ReadCount(&num_results, "function result count"));

        result_types_.resize(num_results);

        for (Index j = 0; j < num_results; ++j) {
          Type result_type;
          CHECK_RESULT(ReadType(&result_type, "function result type"));
          ERROR_UNLESS(IsConcreteType(result_type),
                       "expected valid result type (got " PRItypecode ")",
                       WABT_PRINTF_TYPE_CODE(result_type));
          result_types_[j] = result_type;
        }

        Type* param_types = num_params ? param_types_.data() : nullptr;
        Type* result_types = num_results ? result_types_.data() : nullptr;

        CALLBACK(OnFuncType, i, num_params, param_types, num_results,
                 result_types);
        break;
      }

      case Type::Struct: {
        ERROR_UNLESS(options_.features.gc_enabled(),
                     "invalid type form: struct not allowed");
        Index num_fields;
        CHECK_RESULT(ReadCount(&num_fields, "field count"));

        fields_.resize(num_fields);
        for (Index j = 0; j < num_fields; ++j) {
          CHECK_RESULT(ReadField(&fields_[j]));
        }

        CALLBACK(OnStructType, i, fields_.size(), fields_.data());
        break;
      }

      case Type::Array: {
        ERROR_UNLESS(options_.features.gc_enabled(),
                     "invalid type form: array not allowed");

        TypeMut field;
        CHECK_RESULT(ReadField(&field));
        CALLBACK(OnArrayType, i, field);
        break;
      };

      default:
        PrintError("unexpected type form (got " PRItypecode ")",
                   WABT_PRINTF_TYPE_CODE(form));
        return Result::Error;
    }
  }
  CALLBACK0(EndTypeSection);
  return Result::Ok;
}